

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O2

double chipdf(double x,int df)

{
  char *__format;
  double dVar1;
  
  if (df < 1) {
    __format = "Degree of freedom is a real positive integer";
  }
  else {
    if (0.0 <= x) {
      dVar1 = gammapdf(x,(double)df * 0.5,2.0);
      return dVar1;
    }
    __format = "The range of distribution only takes non-negative and real values";
  }
  printf(__format);
  exit(1);
}

Assistant:

double chipdf(double x, int df) {
	double oup,k;
	if (df <= 0 ) {
		printf("Degree of freedom is a real positive integer");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	
	k = (double) df;
	oup = gammapdf(x,k/2,2.);
	
	return oup;
}